

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

void soul::SourceCodeUtilities::iterateSyntaxTokens
               (CodeLocation *start,
               function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *handleToken)

{
  char cVar1;
  char cVar2;
  TokenType __s1;
  int iVar3;
  size_t sVar4;
  size_type __rlen;
  size_t __n;
  size_t sVar5;
  size_t sVar6;
  char *__s2;
  char *pcVar7;
  char *__s1_00;
  char *__s;
  UTF8Reader UVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  SimpleTokeniser tokeniser;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_a8;
  
  SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)&local_a8,start,false);
  __n = 0;
  __s2 = (char *)0x0;
  __s = (start->location).data;
  while (__s1.text = local_a8.currentType.text, local_a8.currentType.text != "$eof") {
    if (local_a8.currentType.text == (char *)0x0) {
      sVar5 = 4;
      __s1_00 = "hljs";
      UVar8.data = local_a8.location.location.data;
    }
    else {
      iVar3 = strcmp(local_a8.currentType.text,"$eof");
      UVar8.data = local_a8.location.location.data;
      if (iVar3 == 0) break;
      sVar5 = 0xc;
      if (__s1.text != "if") {
        cVar1 = *__s1.text;
        if ((cVar1 == 'i') && (__s1.text[1] == 'f')) {
          bVar10 = __s1.text[2] == '\0';
        }
        else {
          bVar10 = false;
        }
        if ((__s1.text != "do") && (!bVar10)) {
          if ((cVar1 == 'd') && (__s1.text[1] == 'o')) {
            bVar10 = __s1.text[2] == '\0';
          }
          else {
            bVar10 = false;
          }
          if ((((((((((((__s1.text != "for") && (!bVar10)) &&
                      (iVar3 = strcmp(__s1.text,"for"), __s1.text != "let")) &&
                     ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"let"), __s1.text != "var")))) &&
                    (iVar3 != 0)) &&
                   (((iVar3 = strcmp(__s1.text,"var"), __s1.text != "int" && (iVar3 != 0)) &&
                    ((iVar3 = strcmp(__s1.text,"int"), __s1.text != "try" &&
                     (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"try"), __s1.text != "else")) &&
                      (iVar3 != 0)))))))) &&
                  ((iVar3 = strcmp(__s1.text,"else"), __s1.text != "bool" && (iVar3 != 0)))) &&
                 (iVar3 = strcmp(__s1.text,"bool"), __s1.text != "true")) &&
                (((((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"true"), __s1.text != "case")) &&
                   ((iVar3 != 0 &&
                    (((iVar3 = strcmp(__s1.text,"case"), __s1.text != "enum" && (iVar3 != 0)) &&
                     (iVar3 = strcmp(__s1.text,"enum"), __s1.text != "loop")))))) &&
                  ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"loop"), __s1.text != "void")))) &&
                 (iVar3 != 0)))) &&
               ((((iVar3 = strcmp(__s1.text,"void"), __s1.text != "while" && (iVar3 != 0)) &&
                 ((iVar3 = strcmp(__s1.text,"while"), __s1.text != "break" &&
                  ((((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"break"), __s1.text != "const")) &&
                    (iVar3 != 0)) &&
                   ((iVar3 = strcmp(__s1.text,"const"), __s1.text != "int32" && (iVar3 != 0))))))))
                && ((iVar3 = strcmp(__s1.text,"int32"), __s1.text != "int64" &&
                    ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"int64"), __s1.text != "float"))))))))
              && ((((((iVar3 != 0 &&
                      (((iVar3 = strcmp(__s1.text,"float"), __s1.text != "false" && (iVar3 != 0)) &&
                       (iVar3 = strcmp(__s1.text,"false"), __s1.text != "using")))) &&
                     (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"using"), __s1.text != "fixed")) &&
                      (iVar3 != 0)))) &&
                    (((iVar3 = strcmp(__s1.text,"fixed"), __s1.text != "graph" && (iVar3 != 0)) &&
                     ((iVar3 = strcmp(__s1.text,"graph"), __s1.text != "input" &&
                      (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"input"), __s1.text != "event")) &&
                       (iVar3 != 0)))))))) &&
                   ((iVar3 = strcmp(__s1.text,"event"), __s1.text != "class" && (iVar3 != 0)))) &&
                  ((iVar3 = strcmp(__s1.text,"class"), __s1.text != "catch" &&
                   (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"catch"), __s1.text != "throw")) &&
                    ((iVar3 != 0 &&
                     ((((iVar3 = strcmp(__s1.text,"throw"), __s1.text != "output" && (iVar3 != 0))
                       && (iVar3 = strcmp(__s1.text,"output"), __s1.text != "return")) &&
                      ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"return"), __s1.text != "string"))))
                     )))))))))) &&
             (((iVar3 != 0 &&
               ((iVar3 = strcmp(__s1.text,"string"), __s1.text != "struct" && (iVar3 != 0)))) &&
              (((((iVar3 = strcmp(__s1.text,"struct"), __s1.text != "import" &&
                  (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"import"), __s1.text != "switch")) &&
                   (iVar3 != 0)))) &&
                 (((iVar3 = strcmp(__s1.text,"switch"), __s1.text != "public" && (iVar3 != 0)) &&
                  (iVar3 = strcmp(__s1.text,"public"), __s1.text != "double")))) &&
                (((((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"double"), __s1.text != "private")) &&
                   ((iVar3 != 0 &&
                    (((iVar3 = strcmp(__s1.text,"private"), __s1.text != "float32" && (iVar3 != 0))
                     && (iVar3 = strcmp(__s1.text,"float32"), __s1.text != "float64")))))) &&
                  ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"float64"), __s1.text != "default"))))
                 && (iVar3 != 0)))) &&
               (((((iVar3 = strcmp(__s1.text,"default"), __s1.text != "complex" && (iVar3 != 0)) &&
                  ((iVar3 = strcmp(__s1.text,"complex"), __s1.text != "continue" &&
                   ((((((iVar3 != 0 &&
                        (iVar3 = strcmp(__s1.text,"continue"), __s1.text != "external")) &&
                       (iVar3 != 0)) &&
                      ((iVar3 = strcmp(__s1.text,"external"), __s1.text != "operator" &&
                       (iVar3 != 0)))) &&
                     (iVar3 = strcmp(__s1.text,"operator"), __s1.text != "processor")) &&
                    ((iVar3 != 0 &&
                     (iVar3 = strcmp(__s1.text,"processor"), __s1.text != "namespace")))))))) &&
                 (iVar3 != 0)) &&
                ((((iVar3 = strcmp(__s1.text,"namespace"), __s1.text != "complex32" && (iVar3 != 0))
                  && (iVar3 = strcmp(__s1.text,"complex32"), __s1.text != "complex64")) &&
                 (((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"complex64"), __s1.text != "connection")
                   ) && ((iVar3 != 0 && (iVar3 = strcmp(__s1.text,"connection"), iVar3 != 0)))))))))
               ))))) {
            if (__s1.text != ";") {
              if (cVar1 == ';') {
                if (__s1.text[1] != '\0') {
LAB_001ce5f3:
                  bVar10 = false;
LAB_001ce5f5:
                  if ((__s1.text != ",") && (!bVar10)) {
                    if (cVar1 == ',') {
                      if (__s1.text[1] != '\0') {
LAB_001ce641:
                        bVar10 = false;
LAB_001ce643:
                        if ((__s1.text != ")") && (!bVar10)) {
                          if (cVar1 == ')') {
                            if (__s1.text[1] != '\0') {
LAB_001ce68f:
                              bVar10 = false;
LAB_001ce691:
                              if ((__s1.text != "}") && (!bVar10)) {
                                if (cVar1 == '}') {
                                  if ((__s1.text != "[[") && (__s1.text[1] != '\0')) {
LAB_001ce6f6:
                                    bVar11 = false;
LAB_001ce6f8:
                                    bVar10 = bVar11;
                                    bVar11 = false;
LAB_001ce6fa:
                                    if ((__s1.text != "]]") && (!bVar11)) {
                                      if ((cVar1 == ']') && (__s1.text[1] == ']')) {
                                        bVar11 = __s1.text[2] == '\0';
                                      }
                                      else {
                                        bVar11 = false;
                                      }
                                      if ((__s1.text != "[") && (!bVar11)) {
                                        if (bVar10) {
                                          bVar10 = __s1.text[1] == '\0';
                                        }
                                        else {
                                          bVar10 = false;
                                        }
                                        if ((__s1.text != "]") && (!bVar10)) {
                                          if (cVar1 == ']') {
                                            if ((__s1.text != "::") && (__s1.text[1] != '\0')) {
LAB_001ce7b9:
                                              bVar11 = false;
LAB_001ce7bb:
                                              bVar10 = bVar11;
                                              bVar11 = false;
LAB_001ce7bd:
                                              if ((__s1.text != ":") && (!bVar11)) {
                                                if (bVar10) {
                                                  bVar10 = __s1.text[1] == '\0';
                                                }
                                                else {
                                                  bVar10 = false;
                                                }
                                                if ((__s1.text != "?") && (!bVar10)) {
                                                  if (cVar1 == '?') {
                                                    if ((__s1.text != "==") &&
                                                       (__s1.text[1] != '\0')) {
LAB_001ce84a:
                                                      bVar11 = false;
LAB_001ce84c:
                                                      bVar10 = bVar11;
                                                      bVar11 = false;
LAB_001ce84e:
                                                      if ((__s1.text != "=") && (!bVar11)) {
                                                        if (bVar10) {
                                                          bVar10 = __s1.text[1] == '\0';
                                                        }
                                                        else {
                                                          bVar10 = false;
                                                        }
                                                        if ((__s1.text != "!=") && (!bVar10)) {
                                                          if (cVar1 == '!') {
                                                            if (__s1.text[1] == '=') {
                                                              bVar10 = __s1.text[2] == '\0';
                                                            }
                                                            else {
                                                              bVar10 = false;
                                                            }
                                                            if (((__s1.text != "!") && (!bVar10)) &&
                                                               (__s1.text != "+=" &&
                                                                __s1.text[1] != '\0')) {
LAB_001ce917:
                                                              bVar10 = false;
LAB_001ce919:
                                                              bVar11 = false;
LAB_001ce91b:
                                                              if ((__s1.text != "++") && (!bVar11))
                                                              {
                                                                if (bVar10) {
                                                                  if (__s1.text[1] == '+') {
                                                                    bVar10 = __s1.text[2] == '\0';
                                                                  }
                                                                  else {
                                                                    bVar10 = false;
                                                                  }
                                                                  if ((__s1.text != "+") &&
                                                                     (!bVar10)) {
                                                                    bVar10 = __s1.text[1] == '\0';
LAB_001ce97c:
                                                                    if (__s1.text != "-=" && !bVar10
                                                                       ) {
                                                                      if (cVar1 == '-') {
                                                                        cVar2 = __s1.text[1];
                                                                        if (cVar2 == '=') {
                                                                          if (__s1.text[2] != '\0')
                                                                          {
LAB_001cea34:
                                                                            bVar10 = false;
LAB_001cea36:
                                                                            if ((__s1.text != "->")
                                                                               && (!bVar10)) {
                                                                              if (cVar2 == '>') {
                                                                                bVar10 = __s1.text[2
                                                  ] == '\0';
                                                  }
                                                  else {
                                                    bVar10 = false;
                                                  }
                                                  if (((__s1.text != "-") && (!bVar10)) &&
                                                     (__s1.text != "*=" && cVar2 != '\0'))
                                                  goto LAB_001cea90;
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "--") {
                                                    if (cVar2 != '-') goto LAB_001cea34;
                                                    bVar10 = __s1.text[2] == '\0';
                                                    goto LAB_001cea36;
                                                  }
                                                  }
                                                  else if ((__s1.text != "->" && __s1.text != "--")
                                                          && (__s1.text != "*=" && __s1.text != "-")
                                                          ) {
                                                    if (cVar1 == '*') {
                                                      bVar10 = true;
                                                      if (__s1.text[1] != '=') goto LAB_001cea92;
                                                      bVar11 = __s1.text[2] == '\0';
                                                    }
                                                    else {
LAB_001cea90:
                                                      bVar10 = false;
LAB_001cea92:
                                                      bVar11 = false;
                                                    }
                                                    if ((__s1.text != "*") && (!bVar11)) {
                                                      if (bVar10) {
                                                        bVar10 = __s1.text[1] == '\0';
                                                      }
                                                      else {
                                                        bVar10 = false;
                                                      }
                                                      if ((__s1.text != "/=") && (!bVar10)) {
                                                        if (cVar1 == '/') {
                                                          if (__s1.text[1] == '=') {
                                                            bVar10 = __s1.text[2] == '\0';
                                                          }
                                                          else {
                                                            bVar10 = false;
                                                          }
                                                          if (((__s1.text != "/") && (!bVar10)) &&
                                                             (__s1.text != "%=" &&
                                                              __s1.text[1] != '\0')) {
LAB_001ceb5d:
                                                            bVar10 = false;
LAB_001ceb5f:
                                                            bVar11 = false;
LAB_001ceb61:
                                                            if ((__s1.text != "%") && (!bVar11)) {
                                                              if (bVar10) {
                                                                bVar10 = __s1.text[1] == '\0';
                                                              }
                                                              else {
                                                                bVar10 = false;
                                                              }
                                                              if ((__s1.text != "^=") && (!bVar10))
                                                              {
                                                                if (cVar1 == '^') {
                                                                  if (__s1.text[1] == '=') {
                                                                    bVar10 = __s1.text[2] == '\0';
                                                                  }
                                                                  else {
                                                                    bVar10 = false;
                                                                  }
                                                                  if (((__s1.text != "^") &&
                                                                      (!bVar10)) &&
                                                                     (__s1.text != "&=" &&
                                                                      __s1.text[1] != '\0')) {
LAB_001cec2e:
                                                                    bVar10 = false;
LAB_001cec36:
                                                                    bVar11 = false;
LAB_001cec38:
                                                                    if (((__s1.text != "&&=") &&
                                                                        (!bVar11)) &&
                                                                       ((iVar3 = strcmp(__s1.text,
                                                                                        "&&="),
                                                                        __s1.text != "&&" &&
                                                                        (iVar3 != 0)))) {
                                                                      if (bVar10) {
                                                                        if (__s1.text[1] == '&') {
                                                                          bVar10 = __s1.text[2] ==
                                                                                   '\0';
                                                                        }
                                                                        else {
                                                                          bVar10 = false;
                                                                        }
                                                                        if ((__s1.text != "&") &&
                                                                           (!bVar10)) {
                                                                          bVar10 = __s1.text[1] ==
                                                                                   '\0';
LAB_001cecc3:
                                                                          if (__s1.text != "|=" &&
                                                                              !bVar10) {
                                                                            if ((cVar1 == '|') &&
                                                                               (__s1.text[1] == '=')
                                                                               ) {
                                                                              bVar10 = __s1.text[2]
                                                                                       == '\0';
                                                                            }
                                                                            else {
                                                                              bVar10 = false;
                                                                            }
                                                                            if ((((__s1.text !=
                                                                                   "||=") &&
                                                                                 (!bVar10)) &&
                                                                                (iVar3 = strcmp(__s1
                                                  .text,"||="), __s1.text != "||")) && (iVar3 != 0))
                                                  {
                                                    if (cVar1 == '|') {
                                                      if ((__s1.text[1] != '\0') &&
                                                         ((__s1.text[1] != '|' ||
                                                          ((__s1.text != "|" &&
                                                           (__s1.text[2] != '\0')))))) {
LAB_001ced99:
                                                        bVar10 = false;
LAB_001ced9b:
                                                        if (((__s1.text != "<<=") && (!bVar10)) &&
                                                           ((iVar3 = strcmp(__s1.text,"<<="),
                                                            __s1.text != "<<" && (iVar3 != 0)))) {
                                                          if (cVar1 == '<') {
                                                            cVar2 = __s1.text[1];
                                                            if (cVar2 == '<') {
                                                              if (__s1.text[2] != '\0') {
LAB_001cee39:
                                                                bVar10 = false;
LAB_001cee3b:
                                                                if ((__s1.text != "<") && (!bVar10))
                                                                {
                                                                  bVar10 = cVar2 == '\0';
                                                                  goto LAB_001cee58;
                                                                }
                                                              }
                                                            }
                                                            else if (__s1.text != "<=") {
                                                              if (cVar2 != '=') goto LAB_001cee39;
                                                              bVar10 = __s1.text[2] == '\0';
                                                              goto LAB_001cee3b;
                                                            }
                                                          }
                                                          else if (__s1.text != "<" &&
                                                                   __s1.text != "<=") {
                                                            bVar10 = false;
LAB_001cee58:
                                                            if ((((__s1.text != ">>>=" && !bVar10)
                                                                 && (iVar3 = strcmp(__s1.text,">>>="
                                                                                   ),
                                                                    __s1.text != ">>=")) &&
                                                                (iVar3 != 0)) &&
                                                               (((iVar3 = strcmp(__s1.text,">>="),
                                                                 __s1.text != ">>>" && (iVar3 != 0))
                                                                && ((iVar3 = strcmp(__s1.text,">>>")
                                                                    , __s1.text != ">>" &&
                                                                    (iVar3 != 0)))))) {
                                                              if (cVar1 == '>') {
                                                                cVar1 = __s1.text[1];
                                                                if (cVar1 == '>') {
                                                                  if (__s1.text[2] != '\0') {
LAB_001cef3f:
                                                                    bVar10 = false;
LAB_001cef41:
                                                                    if ((cVar1 != '\0') && (!bVar10)
                                                                       ) goto LAB_001cef51;
                                                                  }
                                                                }
                                                                else if (__s1.text != ">=") {
                                                                  if (cVar1 != '=')
                                                                  goto LAB_001cef3f;
                                                                  bVar10 = __s1.text[2] == '\0';
                                                                  goto LAB_001cef41;
                                                                }
                                                              }
                                                              else if (__s1.text != ">" &&
                                                                       __s1.text != ">=") {
LAB_001cef51:
                                                                if ((__s1.text == "$identifier") ||
                                                                   (iVar3 = strcmp(__s1.text,
                                                                                   "$identifier"),
                                                                   iVar3 == 0)) {
                                                                  sVar5 = 9;
                                                                  __s1_00 = "hljs-name";
                                                                }
                                                                else if (((((__s1.text ==
                                                                             "$integer32") ||
                                                                           (iVar3 = strcmp(__s1.text
                                                  ,"$integer32"), __s1.text == "$integer64")) ||
                                                  (iVar3 == 0)) ||
                                                  ((((iVar3 = strcmp(__s1.text,"$integer64"),
                                                     __s1.text == "$float32" || (iVar3 == 0)) ||
                                                    (iVar3 = strcmp(__s1.text,"$float32"),
                                                    __s1.text == "$float64")) ||
                                                   ((iVar3 == 0 ||
                                                    (iVar3 = strcmp(__s1.text,"$float64"),
                                                    __s1.text == "$imag32")))))) ||
                                                  ((iVar3 == 0 ||
                                                   (((iVar3 = strcmp(__s1.text,"$imag32"),
                                                     __s1.text == "$imag64" || (iVar3 == 0)) ||
                                                    (iVar3 = strcmp(__s1.text,"$imag64"), iVar3 == 0
                                                    )))))) {
                                                    sVar5 = 0xb;
                                                    __s1_00 = "hljs-number";
                                                  }
                                                  else if ((__s1.text == "$string literal") ||
                                                          (iVar3 = strcmp(__s1.text,
                                                                          "$string literal"),
                                                          iVar3 == 0)) {
                                                    sVar5 = 0xb;
                                                    __s1_00 = "hljs-string";
                                                  }
                                                  else if (__s1.text == "$comment") {
                                                    __s1_00 = "hljs-comment";
                                                  }
                                                  else {
                                                    iVar3 = strcmp(__s1.text,"$comment");
                                                    sVar5 = (ulong)(iVar3 == 0) * 8 + 4;
                                                    __s1_00 = "hljs";
                                                    if (iVar3 == 0) {
                                                      __s1_00 = "hljs-comment";
                                                    }
                                                  }
                                                  goto LAB_001ce561;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "~" && __s1.text != "|") {
                                                    if (cVar1 != '~') goto LAB_001ced99;
                                                    bVar10 = __s1.text[1] == '\0';
                                                    goto LAB_001ced9b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "&") {
                                                    bVar10 = false;
                                                    goto LAB_001cecc3;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "&=" && __s1.text != "^") {
                                                    if (cVar1 != '&') goto LAB_001cec2e;
                                                    bVar10 = true;
                                                    if (__s1.text[1] != '=') goto LAB_001cec36;
                                                    bVar11 = __s1.text[2] == '\0';
                                                    goto LAB_001cec38;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "%=" && __s1.text != "/") {
                                                    if (cVar1 != '%') goto LAB_001ceb5d;
                                                    bVar10 = true;
                                                    if (__s1.text[1] != '=') goto LAB_001ceb5f;
                                                    bVar11 = __s1.text[2] == '\0';
                                                    goto LAB_001ceb61;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "+") {
                                                    bVar10 = false;
                                                    goto LAB_001ce97c;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "+=" && __s1.text != "!") {
                                                    if (cVar1 != '+') goto LAB_001ce917;
                                                    bVar10 = true;
                                                    if (__s1.text[1] != '=') goto LAB_001ce919;
                                                    bVar11 = __s1.text[2] == '\0';
                                                    goto LAB_001ce91b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (__s1.text != "==") {
                                                    if (cVar1 != '=') goto LAB_001ce84a;
                                                    bVar10 = true;
                                                    bVar11 = true;
                                                    if (__s1.text[1] != '=') goto LAB_001ce84c;
                                                    bVar11 = __s1.text[2] == '\0';
                                                    goto LAB_001ce84e;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else if (__s1.text != "::") {
                                            if (cVar1 != ':') goto LAB_001ce7b9;
                                            bVar10 = true;
                                            bVar11 = true;
                                            if (__s1.text[1] != ':') goto LAB_001ce7bb;
                                            bVar11 = __s1.text[2] == '\0';
                                            goto LAB_001ce7bd;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else if (__s1.text != "[[") {
                                  if (cVar1 != '[') goto LAB_001ce6f6;
                                  bVar10 = true;
                                  bVar11 = true;
                                  if (__s1.text[1] != '[') goto LAB_001ce6f8;
                                  bVar11 = __s1.text[2] == '\0';
                                  goto LAB_001ce6fa;
                                }
                              }
                            }
                          }
                          else if (__s1.text != "{") {
                            if (cVar1 != '{') goto LAB_001ce68f;
                            bVar10 = __s1.text[1] == '\0';
                            goto LAB_001ce691;
                          }
                        }
                      }
                    }
                    else if (__s1.text != "(") {
                      if (cVar1 != '(') goto LAB_001ce641;
                      bVar10 = __s1.text[1] == '\0';
                      goto LAB_001ce643;
                    }
                  }
                }
              }
              else if (__s1.text != ".") {
                if (cVar1 != '.') goto LAB_001ce5f3;
                bVar10 = __s1.text[1] == '\0';
                goto LAB_001ce5f5;
              }
            }
            sVar5 = 0xd;
            __s1_00 = "hljs-operator";
            goto LAB_001ce561;
          }
        }
      }
      __s1_00 = "hljs-keyword";
    }
LAB_001ce561:
    if (((sVar5 != __n) ||
        (iVar3 = bcmp(__s1_00,__s2,__n), sVar6 = __n, pcVar7 = __s2, pcVar9 = __s, iVar3 != 0)) &&
       (sVar4 = (long)UVar8.data - (long)__s, sVar6 = sVar5, pcVar7 = __s1_00, pcVar9 = UVar8.data,
       sVar4 != 0)) {
      local_e8._M_len = __n;
      local_e8._M_str = __s2;
      local_d8._M_len = sVar4;
      local_d8._M_str = __s;
      if ((handleToken->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar10 = (*handleToken->_M_invoker)((_Any_data *)handleToken,&local_d8,&local_e8);
      if (!bVar10) break;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&local_a8);
    __n = sVar6;
    __s2 = pcVar7;
    __s = pcVar9;
  }
  if (*__s != '\0') {
    local_b8._M_len = strlen(__s);
    local_c8._M_len = __n;
    local_c8._M_str = __s2;
    local_b8._M_str = __s;
    if ((handleToken->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*handleToken->_M_invoker)((_Any_data *)handleToken,&local_b8,&local_c8);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&local_a8);
  return;
}

Assistant:

void SourceCodeUtilities::iterateSyntaxTokens (CodeLocation start,
                                               const std::function<bool(std::string_view, std::string_view)>& handleToken)
{
    auto getTokenType = [] (TokenType t) -> std::string_view
    {
       #define SOUL_COMPARE_KEYWORD(name, str) if (t == Keyword::name) return "hljs-keyword";
        SOUL_KEYWORDS (SOUL_COMPARE_KEYWORD)
       #undef SOUL_COMPARE_KEYWORD

       #define SOUL_COMPARE_OPERATOR(name, str) if (t == Operator::name) return "hljs-operator";
        SOUL_OPERATORS (SOUL_COMPARE_OPERATOR)
       #undef SOUL_COMPARE_OPERATOR

        if (t == Token::identifier)      return "hljs-name";
        if (t == Token::literalInt32)    return "hljs-number";
        if (t == Token::literalInt64)    return "hljs-number";
        if (t == Token::literalFloat32)  return "hljs-number";
        if (t == Token::literalFloat64)  return "hljs-number";
        if (t == Token::literalImag32)   return "hljs-number";
        if (t == Token::literalImag64)   return "hljs-number";
        if (t == Token::literalString)   return "hljs-string";
        if (t == Token::comment)         return "hljs-comment";

        return "hljs";
    };

    SimpleTokeniser tokeniser (start, false);
    auto currentSectionStart = start.location;
    std::string_view currentTokenType;

    try
    {
        while (! tokeniser.matches (Token::eof))
        {
            auto newPos = tokeniser.location.location;
            auto newType = getTokenType (tokeniser.currentType);

            if (newType != currentTokenType)
            {
                std::string_view tokenText (currentSectionStart.getAddress(),
                                            static_cast<size_t> (newPos.getAddress() - currentSectionStart.getAddress()));

                if (! tokenText.empty())
                    if (! handleToken (tokenText, currentTokenType))
                        break;

                currentSectionStart = newPos;
                currentTokenType = newType;
            }

            tokeniser.skip();
        }
    }
    catch (const AbortCompilationException&) {}

    if (currentSectionStart.isNotEmpty())
        handleToken (currentSectionStart.getAddress(), currentTokenType);
}